

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O1

uint8_t * __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode::_InternalSerialize
          (TreeEnsembleParameters_TreeNode *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  void *data;
  uint8_t *puVar5;
  uint8_t *puVar6;
  Type *this_00;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int index;
  undefined8 *puVar10;
  size_t __n;
  
  puVar5 = target;
  if (this->treeid_ != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = this->treeid_;
    *target = '\b';
    target[1] = (byte)uVar7;
    if (uVar7 < 0x80) {
      puVar5 = target + 2;
    }
    else {
      target[1] = (byte)uVar7 | 0x80;
      target[2] = (uint8_t)(uVar7 >> 7);
      puVar5 = target + 3;
      if (0x3fff < uVar7) {
        uVar9 = (ulong)target[2];
        uVar7 = uVar7 >> 7;
        do {
          puVar5[-1] = (byte)uVar9 | 0x80;
          uVar8 = uVar7 >> 7;
          *puVar5 = (uint8_t)uVar8;
          puVar5 = puVar5 + 1;
          uVar9 = uVar8 & 0xffffffff;
          bVar2 = 0x3fff < uVar7;
          uVar7 = uVar8;
        } while (bVar2);
      }
    }
  }
  if (this->nodeid_ != 0) {
    puVar6 = puVar5;
    if (stream->end_ <= puVar5) {
      puVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar5);
    }
    uVar7 = this->nodeid_;
    *puVar6 = '\x10';
    puVar6[1] = (byte)uVar7;
    if (uVar7 < 0x80) {
      puVar5 = puVar6 + 2;
    }
    else {
      puVar6[1] = (byte)uVar7 | 0x80;
      puVar6[2] = (uint8_t)(uVar7 >> 7);
      puVar5 = puVar6 + 3;
      if (0x3fff < uVar7) {
        uVar9 = (ulong)puVar6[2];
        uVar7 = uVar7 >> 7;
        do {
          puVar5[-1] = (byte)uVar9 | 0x80;
          uVar8 = uVar7 >> 7;
          *puVar5 = (uint8_t)uVar8;
          puVar5 = puVar5 + 1;
          uVar9 = uVar8 & 0xffffffff;
          bVar2 = 0x3fff < uVar7;
          uVar7 = uVar8;
        } while (bVar2);
      }
    }
  }
  puVar6 = puVar5;
  if (this->nodebehavior_ != 0) {
    if (stream->end_ <= puVar5) {
      puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar5);
    }
    uVar3 = this->nodebehavior_;
    *puVar5 = '\x18';
    puVar5[1] = (byte)uVar3;
    if ((ulong)(long)(int)uVar3 < 0x80) {
      puVar6 = puVar5 + 2;
    }
    else {
      puVar5[1] = (byte)uVar3 | 0x80;
      uVar7 = (ulong)(long)(int)uVar3 >> 7;
      puVar5[2] = (uint8_t)uVar7;
      puVar6 = puVar5 + 3;
      if (0x3fff < uVar3) {
        uVar9 = (ulong)puVar5[2];
        do {
          puVar6[-1] = (byte)uVar9 | 0x80;
          uVar8 = uVar7 >> 7;
          *puVar6 = (uint8_t)uVar8;
          puVar6 = puVar6 + 1;
          uVar9 = uVar8 & 0xffffffff;
          bVar2 = 0x3fff < uVar7;
          uVar7 = uVar8;
        } while (bVar2);
      }
    }
  }
  if (this->branchfeatureindex_ != 0) {
    puVar5 = puVar6;
    if (stream->end_ <= puVar6) {
      puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar6);
    }
    uVar7 = this->branchfeatureindex_;
    *puVar5 = 'P';
    puVar5[1] = (byte)uVar7;
    if (uVar7 < 0x80) {
      puVar6 = puVar5 + 2;
    }
    else {
      puVar5[1] = (byte)uVar7 | 0x80;
      puVar5[2] = (uint8_t)(uVar7 >> 7);
      puVar6 = puVar5 + 3;
      if (0x3fff < uVar7) {
        uVar9 = (ulong)puVar5[2];
        uVar7 = uVar7 >> 7;
        do {
          puVar6[-1] = (byte)uVar9 | 0x80;
          uVar8 = uVar7 >> 7;
          *puVar6 = (uint8_t)uVar8;
          puVar6 = puVar6 + 1;
          uVar9 = uVar8 & 0xffffffff;
          bVar2 = 0x3fff < uVar7;
          uVar7 = uVar8;
        } while (bVar2);
      }
    }
  }
  if (this->branchfeaturevalue_ != 0.0) {
    if (stream->end_ <= puVar6) {
      puVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar6);
    }
    dVar1 = this->branchfeaturevalue_;
    *puVar6 = 'Y';
    *(double *)(puVar6 + 1) = dVar1;
    puVar6 = puVar6 + 9;
  }
  puVar5 = puVar6;
  if (this->truechildnodeid_ != 0) {
    if (stream->end_ <= puVar6) {
      puVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar6);
    }
    uVar7 = this->truechildnodeid_;
    *puVar6 = '`';
    puVar6[1] = (byte)uVar7;
    if (uVar7 < 0x80) {
      puVar5 = puVar6 + 2;
    }
    else {
      puVar6[1] = (byte)uVar7 | 0x80;
      puVar6[2] = (uint8_t)(uVar7 >> 7);
      puVar5 = puVar6 + 3;
      if (0x3fff < uVar7) {
        uVar9 = (ulong)puVar6[2];
        uVar7 = uVar7 >> 7;
        do {
          puVar5[-1] = (byte)uVar9 | 0x80;
          uVar8 = uVar7 >> 7;
          *puVar5 = (uint8_t)uVar8;
          puVar5 = puVar5 + 1;
          uVar9 = uVar8 & 0xffffffff;
          bVar2 = 0x3fff < uVar7;
          uVar7 = uVar8;
        } while (bVar2);
      }
    }
  }
  puVar6 = puVar5;
  if (this->falsechildnodeid_ != 0) {
    if (stream->end_ <= puVar5) {
      puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar5);
    }
    uVar7 = this->falsechildnodeid_;
    *puVar5 = 'h';
    puVar5[1] = (byte)uVar7;
    if (uVar7 < 0x80) {
      puVar6 = puVar5 + 2;
    }
    else {
      puVar5[1] = (byte)uVar7 | 0x80;
      puVar5[2] = (uint8_t)(uVar7 >> 7);
      puVar6 = puVar5 + 3;
      if (0x3fff < uVar7) {
        uVar9 = (ulong)puVar5[2];
        uVar7 = uVar7 >> 7;
        do {
          puVar6[-1] = (byte)uVar9 | 0x80;
          uVar8 = uVar7 >> 7;
          *puVar6 = (uint8_t)uVar8;
          puVar6 = puVar6 + 1;
          uVar9 = uVar8 & 0xffffffff;
          bVar2 = 0x3fff < uVar7;
          uVar7 = uVar8;
        } while (bVar2);
      }
    }
  }
  if (this->missingvaluetrackstruechild_ == true) {
    if (stream->end_ <= puVar6) {
      puVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar6);
    }
    bVar2 = this->missingvaluetrackstruechild_;
    *puVar6 = 'p';
    puVar6[1] = bVar2;
    puVar6 = puVar6 + 2;
  }
  iVar4 = (this->evaluationinfo_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar4 != 0) {
    index = 0;
    do {
      if (stream->end_ <= puVar6) {
        puVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar6);
      }
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>::TypeHandler>
                          (&(this->evaluationinfo_).super_RepeatedPtrFieldBase,index);
      puVar6[0] = 0xa2;
      puVar6[1] = '\x01';
      uVar3 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
      puVar6[2] = (uint8_t)uVar3;
      if (uVar3 < 0x80) {
        puVar6 = puVar6 + 3;
      }
      else {
        puVar6 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                           (uVar3,puVar6 + 2);
      }
      puVar6 = TreeEnsembleParameters_TreeNode_EvaluationInfo::_InternalSerialize
                         (this_00,puVar6,stream);
      index = index + 1;
    } while (iVar4 != index);
  }
  if (this->relativehitrate_ != 0.0) {
    if (stream->end_ <= puVar6) {
      puVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar6);
    }
    dVar1 = this->relativehitrate_;
    puVar6[0] = 0xf1;
    puVar6[1] = '\x01';
    *(double *)(puVar6 + 2) = dVar1;
    puVar6 = puVar6 + 10;
  }
  uVar7 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar7 & 1) != 0) {
    data = *(void **)((uVar7 & 0xfffffffffffffffc) + 8);
    uVar7 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar7 & 1) == 0) {
      puVar10 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar10 = (undefined8 *)((uVar7 & 0xfffffffffffffffc) + 8);
    }
    __n = (size_t)(int)puVar10[1];
    if ((long)stream->end_ - (long)puVar6 < (long)__n) {
      puVar5 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,data,(int)puVar10[1],puVar6);
      return puVar5;
    }
    memcpy(puVar6,data,__n);
    puVar6 = puVar6 + __n;
  }
  return puVar6;
}

Assistant:

uint8_t* TreeEnsembleParameters_TreeNode::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.TreeEnsembleParameters.TreeNode)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 treeId = 1;
  if (this->_internal_treeid() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(1, this->_internal_treeid(), target);
  }

  // uint64 nodeId = 2;
  if (this->_internal_nodeid() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(2, this->_internal_nodeid(), target);
  }

  // .CoreML.Specification.TreeEnsembleParameters.TreeNode.TreeNodeBehavior nodeBehavior = 3;
  if (this->_internal_nodebehavior() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      3, this->_internal_nodebehavior(), target);
  }

  // uint64 branchFeatureIndex = 10;
  if (this->_internal_branchfeatureindex() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(10, this->_internal_branchfeatureindex(), target);
  }

  // double branchFeatureValue = 11;
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_branchfeaturevalue = this->_internal_branchfeaturevalue();
  uint64_t raw_branchfeaturevalue;
  memcpy(&raw_branchfeaturevalue, &tmp_branchfeaturevalue, sizeof(tmp_branchfeaturevalue));
  if (raw_branchfeaturevalue != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(11, this->_internal_branchfeaturevalue(), target);
  }

  // uint64 trueChildNodeId = 12;
  if (this->_internal_truechildnodeid() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(12, this->_internal_truechildnodeid(), target);
  }

  // uint64 falseChildNodeId = 13;
  if (this->_internal_falsechildnodeid() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(13, this->_internal_falsechildnodeid(), target);
  }

  // bool missingValueTracksTrueChild = 14;
  if (this->_internal_missingvaluetrackstruechild() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(14, this->_internal_missingvaluetrackstruechild(), target);
  }

  // repeated .CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo evaluationInfo = 20;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_evaluationinfo_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(20, this->_internal_evaluationinfo(i), target, stream);
  }

  // double relativeHitRate = 30;
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_relativehitrate = this->_internal_relativehitrate();
  uint64_t raw_relativehitrate;
  memcpy(&raw_relativehitrate, &tmp_relativehitrate, sizeof(tmp_relativehitrate));
  if (raw_relativehitrate != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(30, this->_internal_relativehitrate(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.TreeEnsembleParameters.TreeNode)
  return target;
}